

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_combo_begin_text(nk_context *ctx,char *selected,int len,nk_vec2 size)

{
  nk_vec2 nVar1;
  nk_window *win;
  nk_rect r;
  nk_rect rect;
  nk_rect header_00;
  undefined8 uVar2;
  nk_widget_layout_states nVar3;
  int iVar4;
  long lVar5;
  nk_context *i;
  nk_style_combo *pnVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar7;
  float fVar8;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect b;
  nk_rect header;
  nk_text text;
  nk_rect local_c0;
  int local_ac;
  nk_rect local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  nk_text local_80;
  char *local_70;
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x6018,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  if (selected == (char *)0x0) {
    __assert_fail("selected",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x6019,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x601a,
                  "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)")
    ;
  }
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = size;
  local_68._12_4_ = in_XMM0_Dd;
  if (win->layout != (nk_panel *)0x0) {
    nVar3 = nk_widget(&local_c0,ctx);
    if (nVar3 == NK_WIDGET_INVALID) {
      iVar4 = 0;
    }
    else {
      i = ctx;
      if ((win->layout->flags & 0x1000) != 0) {
        i = (nk_context *)0x0;
      }
      if (nVar3 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      local_98 = CONCAT44(local_c0.h,local_c0.w);
      r.w = local_c0.w;
      r.x = local_c0.x;
      r.y = local_c0.y;
      r.h = local_c0.h;
      local_a8.x = local_c0.x;
      local_a8.y = local_c0.y;
      local_a8.w = 0.0;
      local_a8.h = 0.0;
      uStack_90 = 0;
      iVar4 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      uVar2 = local_98;
      if ((ctx->last_widget_state & 0x20) == 0) {
        if ((ctx->last_widget_state & 0x10) == 0) {
          pnVar6 = &(ctx->style).combo;
          local_80.text = (ctx->style).combo.label_normal;
        }
        else {
          pnVar6 = (nk_style_combo *)&(ctx->style).combo.hover;
          local_80.text = (ctx->style).combo.label_hover;
        }
      }
      else {
        pnVar6 = (nk_style_combo *)&(ctx->style).combo.active;
        local_80.text = (ctx->style).combo.label_active;
      }
      local_98 = CONCAT44(local_98._4_4_,(uint)(iVar4 != 0));
      local_ac = len;
      local_70 = selected;
      if ((pnVar6->normal).type == NK_STYLE_ITEM_IMAGE) {
        local_80.background.r = '\0';
        local_80.background.g = '\0';
        local_80.background.b = '\0';
        local_80.background.a = '\0';
        local_98._0_4_ = (int)uVar2;
        local_98._4_4_ = SUB84(uVar2,4);
        r_00.w = (float)(int)local_98;
        r_00.h = (float)local_98._4_4_;
        r_00.x = local_a8.x;
        r_00.y = local_a8.y;
        nk_draw_image(&win->buffer,r_00,&(pnVar6->normal).data.image,(nk_color)0xffffffff);
      }
      else {
        local_80.background = (pnVar6->normal).data.color;
        local_98._0_4_ = (int)uVar2;
        local_98._4_4_ = SUB84(uVar2,4);
        rect_00.w = (float)(int)local_98;
        rect_00.h = (float)local_98._4_4_;
        rect_00.x = local_a8.x;
        rect_00.y = local_a8.y;
        nk_fill_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,local_80.background);
        rect.w = local_c0.w;
        rect.x = local_c0.x;
        rect.y = local_c0.y;
        rect.h = local_c0.h;
        nk_stroke_rect(&win->buffer,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                       (ctx->style).combo.border_color);
      }
      lVar5 = 0x1be4;
      if ((ctx->last_widget_state & 0x10) == 0) {
        lVar5 = (ulong)(iVar4 != 0) * 8 + 0x1be0;
      }
      local_a8.x = (float)*(undefined4 *)((long)&(ctx->input).keyboard.keys[0].down + lVar5);
      local_40.y = (ctx->style).combo.button_padding.y;
      local_40.w = local_c0.h - (local_40.y + local_40.y);
      local_40.x = ((local_c0.w + local_c0.x) - local_c0.h) - (ctx->style).combo.button_padding.x;
      local_40.y = local_c0.y + local_40.y;
      nVar1 = (ctx->style).combo.button.padding;
      fVar7 = nVar1.x;
      local_50.y = nVar1.y;
      local_50.x = local_40.x + fVar7;
      local_50.w = local_40.w - (fVar7 + fVar7);
      local_50.h = local_40.w - (local_50.y + local_50.y);
      local_80.padding.x = 0.0;
      local_80.padding.y = 0.0;
      local_50.y = local_40.y + local_50.y;
      nVar1 = (ctx->style).combo.content_padding;
      fVar7 = nVar1.x;
      b.x = local_c0.x + fVar7;
      fVar8 = nVar1.y;
      b.y = local_c0.y + fVar8;
      b.w = (local_40.x - ((ctx->style).combo.spacing.x + fVar7)) - b.x;
      b.h = local_c0.h - (fVar8 + fVar8);
      local_40.h = local_40.w;
      nk_widget_text(&win->buffer,b,local_70,local_ac,&local_80,0x11,(ctx->style).font);
      nk_draw_button_symbol
                (&win->buffer,&local_40,&local_50,ctx->last_widget_state,&(ctx->style).combo.button,
                 (nk_symbol_type)local_a8.x,(ctx->style).font);
      header_00.w = local_c0.w;
      header_00.x = local_c0.x;
      header_00.y = local_c0.y;
      header_00.h = local_c0.h;
      iVar4 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,(int)local_98,header_00);
    }
    return iVar4;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x601b,
                "int nk_combo_begin_text(struct nk_context *, const char *, int, struct nk_vec2)");
}

Assistant:

NK_API int
nk_combo_begin_text(struct nk_context *ctx, const char *selected, int len,
    struct nk_vec2 size)
{
    const struct nk_input *in;
    struct nk_window *win;
    struct nk_style *style;

    enum nk_widget_layout_states s;
    int is_clicked = nk_false;
    struct nk_rect header;
    const struct nk_style_item *background;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(selected);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !selected)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        /* print currently selected text item */
        struct nk_rect label;
        struct nk_rect button;
        struct nk_rect content;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw selected label */
        text.padding = nk_vec2(0,0);
        label.x = header.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = button.x - (style->combo.content_padding.x + style->combo.spacing.x) - label.x;;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text,
            NK_TEXT_LEFT, ctx->style.font);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}